

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_record.cc
# Opt level: O0

void __thiscall RecordField::RecordField(RecordField *this,FieldType tof,ID *id,Type *type)

{
  undefined8 *in_RDI;
  Type *in_stack_00000028;
  ID *in_stack_00000030;
  int in_stack_00000038;
  FieldType in_stack_0000003c;
  Field *in_stack_00000040;
  
  Field::Field(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030,
               in_stack_00000028);
  *in_RDI = &PTR__RecordField_0017a6e8;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  in_RDI[0x16] = 0;
  *(undefined4 *)((long)in_RDI + 0xbc) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x18) = 0;
  *(undefined1 *)(in_RDI + 0x17) = 0;
  return;
}

Assistant:

RecordField::RecordField(FieldType tof, ID* id, Type* type)
	: Field(tof, TYPE_TO_BE_PARSED | CLASS_MEMBER | PUBLIC_READABLE, id, type)
	{
	begin_of_field_dataptr = nullptr;
	end_of_field_dataptr = nullptr;
	field_size_expr = nullptr;
	field_offset_expr = nullptr;
	end_of_field_dataptr_var = nullptr;
	record_type_ = nullptr;
	prev_ = nullptr;
	next_ = nullptr;
	static_offset_ = -1;
	parsing_state_seq_ = 0;
	boundary_checked_ = false;
	}